

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oss.cpp
# Opt level: O1

int __thiscall
anon_unknown.dwarf_273a44::OSScapture::open(OSScapture *this,char *__file,int __oflag,...)

{
  ALCdevice *pAVar1;
  RingBuffer *ptr;
  bool bVar2;
  __atomic_base<unsigned_long> _Var3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  backend_exception *pbVar9;
  ALCchar *pAVar10;
  char *pcVar11;
  int *piVar12;
  uint uVar13;
  long lVar14;
  char *pcVar15;
  char *pcVar16;
  int ossFormat;
  ALuint numChannels;
  ALuint ossSpeed;
  ALuint numFragmentsLogSize;
  audio_buf_info info;
  uint local_64;
  uint local_60;
  ALuint local_5c;
  __atomic_base<unsigned_long> local_58;
  uint local_4c;
  size_t local_48 [3];
  
  if (__file == (char *)0x0) {
    pcVar16 = (char *)&(anonymous_namespace)::DefaultCapture_abi_cxx11_;
    __file = "OSS Default";
  }
  else {
    if ((anonymous_namespace)::CaptureDevices == DAT_0022e588) {
      ALCossListPopulate((vector<DevMap> *)&(anonymous_namespace)::CaptureDevices,0x10000);
    }
    pcVar11 = DAT_0022e588;
    lVar14 = (long)DAT_0022e588 - (long)(anonymous_namespace)::CaptureDevices >> 8;
    pcVar15 = (anonymous_namespace)::CaptureDevices;
    if (0 < lVar14) {
      lVar14 = lVar14 + 1;
      do {
        iVar4 = std::__cxx11::string::compare(pcVar15);
        pcVar16 = pcVar15;
        if (iVar4 == 0) goto LAB_00165a4b;
        iVar4 = std::__cxx11::string::compare(pcVar15 + 0x40);
        pcVar16 = pcVar15 + 0x40;
        if (iVar4 == 0) goto LAB_00165a4b;
        iVar4 = std::__cxx11::string::compare(pcVar15 + 0x80);
        pcVar16 = pcVar15 + 0x80;
        if (iVar4 == 0) goto LAB_00165a4b;
        iVar4 = std::__cxx11::string::compare(pcVar15 + 0xc0);
        pcVar16 = pcVar15 + 0xc0;
        if (iVar4 == 0) goto LAB_00165a4b;
        pcVar15 = pcVar15 + 0x100;
        lVar14 = lVar14 + -1;
      } while (1 < lVar14);
    }
    lVar14 = (long)pcVar11 - (long)pcVar15 >> 6;
    if (lVar14 == 1) {
LAB_00165a22:
      iVar4 = std::__cxx11::string::compare(pcVar15);
      pcVar16 = pcVar11;
      if (iVar4 == 0) {
        pcVar16 = pcVar15;
      }
    }
    else {
      pcVar16 = pcVar15;
      if (lVar14 == 2) {
LAB_00165a0f:
        iVar4 = std::__cxx11::string::compare(pcVar16);
        if (iVar4 != 0) {
          pcVar15 = pcVar16 + 0x40;
          goto LAB_00165a22;
        }
      }
      else {
        pcVar16 = pcVar11;
        if ((lVar14 == 3) &&
           (iVar4 = std::__cxx11::string::compare(pcVar15), pcVar16 = pcVar15, iVar4 != 0)) {
          pcVar16 = pcVar15 + 0x40;
          goto LAB_00165a0f;
        }
      }
    }
LAB_00165a4b:
    if (pcVar16 == DAT_0022e588) {
      pbVar9 = (backend_exception *)__cxa_allocate_exception(0x30);
      al::backend_exception::backend_exception(pbVar9,0xa004,"Device name \"%s\" not found",__file);
      __cxa_throw(pbVar9,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
    }
    pcVar16 = pcVar16 + 0x20;
  }
  pcVar16 = *(char **)pcVar16;
  iVar4 = ::open(pcVar16,0);
  this->mFd = iVar4;
  if (iVar4 == -1) {
    pbVar9 = (backend_exception *)__cxa_allocate_exception(0x30);
    piVar12 = __errno_location();
    pcVar11 = strerror(*piVar12);
    al::backend_exception::backend_exception(pbVar9,0xa004,"Could not open %s: %s",pcVar16,pcVar11);
  }
  else {
    local_64 = 0;
    pAVar1 = (this->super_BackendBase).mDevice;
    switch(pAVar1->FmtType) {
    case DevFmtByte:
      local_64 = 0x40;
      break;
    case DevFmtUByte:
      local_64 = 8;
      break;
    case DevFmtShort:
      local_64 = 0x10;
      break;
    case DevFmtUShort:
    case DevFmtInt:
    case DevFmtUInt:
    case DevFmtFloat:
      pbVar9 = (backend_exception *)__cxa_allocate_exception(0x30);
      pAVar10 = DevFmtTypeString(((this->super_BackendBase).mDevice)->FmtType);
      al::backend_exception::backend_exception
                (pbVar9,0xa004,"%s capture samples not supported",pAVar10);
      goto LAB_00165e98;
    }
    uVar5 = ChannelsFromDevFmt(pAVar1->FmtChans,pAVar1->mAmbiOrder);
    local_60 = uVar5;
    uVar6 = BytesFromDevFmt(((this->super_BackendBase).mDevice)->FmtType);
    pAVar1 = (this->super_BackendBase).mDevice;
    local_5c = pAVar1->Frequency;
    uVar13 = pAVar1->BufferSize * uVar6 * uVar5;
    uVar7 = 0;
    if (7 < uVar13) {
      uVar7 = 0;
      uVar13 = uVar13 >> 2;
      do {
        uVar7 = uVar7 + 1;
        bVar2 = 3 < uVar13;
        uVar13 = uVar13 >> 1;
      } while (bVar2);
    }
    local_4c = 4;
    if (4 < uVar7) {
      local_4c = uVar7;
    }
    local_4c = local_4c | 0x40000;
    local_48[0] = 0;
    local_48[1] = 0;
    iVar4 = ioctl(this->mFd,0xc004500a);
    if (iVar4 < 0) {
      pbVar9 = (backend_exception *)__cxa_allocate_exception(0x30);
      piVar12 = __errno_location();
      pcVar16 = strerror(*piVar12);
      al::backend_exception::backend_exception
                (pbVar9,0xa004,"ioctl(mFd, SNDCTL_DSP_SETFRAGMENT, &numFragmentsLogSize) failed: %s"
                 ,pcVar16);
    }
    else {
      iVar4 = ioctl(this->mFd,0xc0045005,&local_64);
      if (iVar4 < 0) {
        pbVar9 = (backend_exception *)__cxa_allocate_exception(0x30);
        piVar12 = __errno_location();
        pcVar16 = strerror(*piVar12);
        al::backend_exception::backend_exception
                  (pbVar9,0xa004,"ioctl(mFd, SNDCTL_DSP_SETFMT, &ossFormat) failed: %s",pcVar16);
      }
      else {
        iVar4 = ioctl(this->mFd,0xc0045006,&local_60);
        if (iVar4 < 0) {
          pbVar9 = (backend_exception *)__cxa_allocate_exception(0x30);
          piVar12 = __errno_location();
          pcVar16 = strerror(*piVar12);
          al::backend_exception::backend_exception
                    (pbVar9,0xa004,"ioctl(mFd, SNDCTL_DSP_CHANNELS, &numChannels) failed: %s",
                     pcVar16);
        }
        else {
          iVar4 = ioctl(this->mFd,0xc0045002,&local_5c);
          if (iVar4 < 0) {
            pbVar9 = (backend_exception *)__cxa_allocate_exception(0x30);
            piVar12 = __errno_location();
            pcVar16 = strerror(*piVar12);
            al::backend_exception::backend_exception
                      (pbVar9,0xa004,"ioctl(mFd, SNDCTL_DSP_SPEED, &ossSpeed) failed: %s",pcVar16);
          }
          else {
            iVar4 = ioctl(this->mFd,0x8010500d,local_48);
            if (iVar4 < 0) {
              pbVar9 = (backend_exception *)__cxa_allocate_exception(0x30);
              piVar12 = __errno_location();
              pcVar16 = strerror(*piVar12);
              al::backend_exception::backend_exception
                        (pbVar9,0xa004,"ioctl(mFd, SNDCTL_DSP_GETISPACE, &info) failed: %s",pcVar16)
              ;
            }
            else {
              pAVar1 = (this->super_BackendBase).mDevice;
              uVar8 = ChannelsFromDevFmt(pAVar1->FmtChans,pAVar1->mAmbiOrder);
              if (uVar8 == local_60) {
                if (local_64 == 8) {
                  if (((this->super_BackendBase).mDevice)->FmtType == DevFmtUByte)
                  goto LAB_00165c2b;
                }
                else if (local_64 == 0x10) {
                  if (((this->super_BackendBase).mDevice)->FmtType == DevFmtShort)
                  goto LAB_00165c2b;
                }
                else if ((local_64 == 0x40) &&
                        (((this->super_BackendBase).mDevice)->FmtType == DevFmtByte)) {
LAB_00165c2b:
                  RingBuffer::Create((RingBuffer *)&local_58,
                                     (ulong)((this->super_BackendBase).mDevice)->BufferSize,
                                     (ulong)(uVar6 * uVar5),0);
                  _Var3._M_i = local_58._M_i;
                  local_58._M_i = 0;
                  ptr = (this->mRing)._M_t.
                        super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
                        super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
                        super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl;
                  (this->mRing)._M_t.
                  super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
                  super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
                  super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl = (RingBuffer *)_Var3._M_i
                  ;
                  if (ptr != (RingBuffer *)0x0) {
                    al_free(ptr);
                  }
                  if ((void *)local_58._M_i != (void *)0x0) {
                    al_free((void *)local_58._M_i);
                  }
                  pAVar1 = (this->super_BackendBase).mDevice;
                  pcVar16 = (char *)(pAVar1->DeviceName)._M_string_length;
                  strlen(__file);
                  iVar4 = std::__cxx11::string::_M_replace
                                    ((ulong)&pAVar1->DeviceName,0,pcVar16,(ulong)__file);
                  return iVar4;
                }
                pbVar9 = (backend_exception *)__cxa_allocate_exception(0x30);
                pAVar10 = DevFmtTypeString(((this->super_BackendBase).mDevice)->FmtType);
                al::backend_exception::backend_exception
                          (pbVar9,0xa004,"Failed to set %s samples, got OSS format %#x",pAVar10,
                           (ulong)local_64);
              }
              else {
                pbVar9 = (backend_exception *)__cxa_allocate_exception(0x30);
                pAVar10 = DevFmtChannelsString(((this->super_BackendBase).mDevice)->FmtChans);
                al::backend_exception::backend_exception
                          (pbVar9,0xa004,"Failed to set %s, got %d channels instead",pAVar10,
                           (ulong)local_60);
              }
            }
          }
        }
      }
    }
  }
LAB_00165e98:
  __cxa_throw(pbVar9,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
}

Assistant:

void OSScapture::open(const ALCchar *name)
{
    const char *devname{DefaultCapture.c_str()};
    if(!name)
        name = DefaultName;
    else
    {
        if(CaptureDevices.empty())
            ALCossListPopulate(CaptureDevices, DSP_CAP_INPUT);

        auto iter = std::find_if(CaptureDevices.cbegin(), CaptureDevices.cend(),
            [&name](const DevMap &entry) -> bool
            { return entry.name == name; }
        );
        if(iter == CaptureDevices.cend())
            throw al::backend_exception{ALC_INVALID_VALUE, "Device name \"%s\" not found", name};
        devname = iter->device_name.c_str();
    }

    mFd = ::open(devname, O_RDONLY);
    if(mFd == -1)
        throw al::backend_exception{ALC_INVALID_VALUE, "Could not open %s: %s", devname,
            strerror(errno)};

    int ossFormat{};
    switch(mDevice->FmtType)
    {
    case DevFmtByte:
        ossFormat = AFMT_S8;
        break;
    case DevFmtUByte:
        ossFormat = AFMT_U8;
        break;
    case DevFmtShort:
        ossFormat = AFMT_S16_NE;
        break;
    case DevFmtUShort:
    case DevFmtInt:
    case DevFmtUInt:
    case DevFmtFloat:
        throw al::backend_exception{ALC_INVALID_VALUE, "%s capture samples not supported",
            DevFmtTypeString(mDevice->FmtType)};
    }

    ALuint periods{4};
    ALuint numChannels{mDevice->channelsFromFmt()};
    ALuint frameSize{numChannels * mDevice->bytesFromFmt()};
    ALuint ossSpeed{mDevice->Frequency};
    /* according to the OSS spec, 16 bytes are the minimum */
    ALuint log2FragmentSize{maxu(log2i(mDevice->BufferSize * frameSize / periods), 4)};
    ALuint numFragmentsLogSize{(periods << 16) | log2FragmentSize};

    audio_buf_info info{};
#define CHECKERR(func) if((func) < 0) {                                       \
    throw al::backend_exception{ALC_INVALID_VALUE, #func " failed: %s", strerror(errno)}; \
}
    CHECKERR(ioctl(mFd, SNDCTL_DSP_SETFRAGMENT, &numFragmentsLogSize));
    CHECKERR(ioctl(mFd, SNDCTL_DSP_SETFMT, &ossFormat));
    CHECKERR(ioctl(mFd, SNDCTL_DSP_CHANNELS, &numChannels));
    CHECKERR(ioctl(mFd, SNDCTL_DSP_SPEED, &ossSpeed));
    CHECKERR(ioctl(mFd, SNDCTL_DSP_GETISPACE, &info));
#undef CHECKERR

    if(mDevice->channelsFromFmt() != numChannels)
        throw al::backend_exception{ALC_INVALID_VALUE,
            "Failed to set %s, got %d channels instead", DevFmtChannelsString(mDevice->FmtChans),
            numChannels};

    if(!((ossFormat == AFMT_S8 && mDevice->FmtType == DevFmtByte)
        || (ossFormat == AFMT_U8 && mDevice->FmtType == DevFmtUByte)
        || (ossFormat == AFMT_S16_NE && mDevice->FmtType == DevFmtShort)))
        throw al::backend_exception{ALC_INVALID_VALUE,
            "Failed to set %s samples, got OSS format %#x", DevFmtTypeString(mDevice->FmtType),
            ossFormat};

    mRing = RingBuffer::Create(mDevice->BufferSize, frameSize, false);

    mDevice->DeviceName = name;
}